

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::bson::
basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::visit_byte_string(basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
                    *this,byte_string_view *b,uint64_t ext_tag,ser_context *param_4,error_code *ec)

{
  bool bVar1;
  size_type sVar2;
  const_iterator puVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  d_first;
  size_type sVar4;
  byte_string_view *in_RSI;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_RDI;
  uint8_t in_stack_0000000f;
  basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
  *in_stack_00000010;
  size_t length;
  uint8_t c;
  const_iterator __end3;
  const_iterator __begin3;
  byte_string_view *__range3;
  size_t string_offset;
  size_t offset;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  error_code *in_stack_ffffffffffffff60;
  value_type_conflict *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff88;
  
  bVar1 = std::
          vector<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
          ::empty((vector<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
                   *)in_stack_ffffffffffffff60);
  if (bVar1) {
    std::error_code::operator=(in_stack_ffffffffffffff60,(bson_errc)((ulong)in_RDI >> 0x20));
  }
  else {
    before_value(in_stack_00000010,in_stack_0000000f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 9));
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this_00,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff70);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 9));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (this_00,(value_type_conflict *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    puVar3 = byte_string_view::begin(in_RSI);
    d_first._M_current = byte_string_view::end(in_RSI);
    for (; puVar3 != d_first._M_current; puVar3 = puVar3 + 1) {
      in_stack_ffffffffffffff7c = CONCAT13(*puVar3,(int3)in_stack_ffffffffffffff7c);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff60,
                 (value_type_conflict *)in_RDI);
    }
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 9));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(((int)sVar4 - (int)sVar2) + -1,in_stack_ffffffffffffff48));
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+(in_RDI,(difference_type)this_00);
    binary::
    native_to_little<unsigned_int,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
              (in_stack_ffffffffffffff7c,d_first);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
        uint64_t ext_tag, 
        const ser_context&,
        std::error_code& ec) override
    {
        if (stack_.empty())
        {
            ec = bson_errc::expected_bson_document;
            JSONCONS_VISITOR_RETURN;
        }
        before_value(jsoncons::bson::bson_type::binary_type);

        std::size_t offset = buffer_.size();
        buffer_.insert(buffer_.end(), sizeof(int32_t), 0);
        std::size_t string_offset = buffer_.size();

        buffer_.push_back(static_cast<uint8_t>(ext_tag)); // default subtype

        for (auto c : b)
        {
            buffer_.push_back(c);
        }
        std::size_t length = buffer_.size() - string_offset - 1;
        binary::native_to_little(static_cast<uint32_t>(length), buffer_.begin()+offset);

        JSONCONS_VISITOR_RETURN;
    }